

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::Message**,std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>>
               (__normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                begin,__normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                      end)

{
  Message *pMVar1;
  
  while (begin._M_current != end._M_current) {
    pMVar1 = *begin._M_current;
    begin._M_current = begin._M_current + 1;
    if (pMVar1 != (Message *)0x0) {
      (*(pMVar1->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}